

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  uint uVar1;
  int32_t iVar2;
  ImGuiIO *drawData;
  ImGuiIO *p_open;
  ImDrawData *__stat_loc;
  undefined8 *in_RSI;
  int in_EDI;
  float fVar3;
  char *pcVar4;
  ImGuiStyle *in_stack_000000b0;
  ImGuiWindowFlags in_stack_00000124;
  bool *in_stack_00000128;
  char *in_stack_00000130;
  VSync vsync;
  int height;
  int width;
  uchar *pixels;
  ImGuiWS imguiWS;
  ImGuiIO *io;
  string httpRoot;
  int port;
  double rate_fps;
  float in_stack_fffffffffffffd20;
  float in_stack_fffffffffffffd24;
  int *in_stack_fffffffffffffd28;
  VSync *in_stack_fffffffffffffd30;
  uchar **in_stack_fffffffffffffd38;
  ImFontAtlas *in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  ImFontAtlas *in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  string *local_258;
  allocator<char> *paVar5;
  string *psVar6;
  ImGuiWS *this;
  ImVec4 *border_col;
  ImVec2 in_stack_fffffffffffffdf0;
  ImVec2 in_stack_fffffffffffffdf8;
  ImVec2 *in_stack_fffffffffffffe00;
  ImVec2 *in_stack_fffffffffffffe08;
  ImTextureID in_stack_fffffffffffffe10;
  float in_stack_fffffffffffffe1c;
  ImVec2 in_stack_fffffffffffffe20;
  ImVec2 local_1d8;
  ImVec2 local_1d0;
  ImVec4 local_1c8;
  ImVec4 local_1b8;
  ImVec2 local_1a8;
  ImVec2 local_1a0;
  ImVec2 local_198;
  ImVec4 local_190;
  ImVec4 local_180;
  ImVec2 local_170;
  ImVec2 local_168;
  ImVec2 local_160;
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 local_148;
  ImVec2 local_140;
  ImVec2 local_138;
  ImVec2 local_130;
  ImVec2 local_128;
  VSync local_120;
  undefined1 local_f3;
  allocator<char> local_f2;
  undefined1 local_f1 [9];
  string local_e8 [32];
  char local_c8 [32];
  string *local_a8;
  undefined8 local_a0;
  string local_80 [32];
  ImGuiWS local_60;
  ImGuiIO *local_58;
  undefined1 local_39 [37];
  uint local_14;
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  printf("Usage: %s [port] [http-root]\n",*in_RSI);
  local_14 = 5000;
  border_col = (ImVec4 *)local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
             ,(allocator<char> *)in_stack_fffffffffffffd50);
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  if (1 < local_8) {
    local_14 = atoi((char *)local_10[1]);
  }
  if (2 < local_8) {
    std::__cxx11::string::operator=((string *)(local_39 + 1),(char *)local_10[2]);
  }
  rate_fps = 9.88131291682493e-324;
  ImGui::DebugCheckVersionAndDataLayout
            ((char *)in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38,
             (size_t)in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),2,
             (size_t)in_stack_fffffffffffffd50);
  ImGui::CreateContext(in_stack_fffffffffffffd50);
  local_58 = ImGui::GetIO();
  ImGui::StyleColorsDark(in_stack_000000b0);
  ImGuiWS::ImGuiWS((ImGuiWS *)in_stack_fffffffffffffd30);
  uVar1 = local_14;
  std::operator+(in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
  local_f3 = 1;
  psVar6 = local_e8;
  this = (ImGuiWS *)local_f1;
  local_f1._1_8_ = psVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
             ,(allocator<char> *)in_stack_fffffffffffffd50);
  pcVar4 = local_c8;
  paVar5 = &local_f2;
  local_f1._1_8_ = pcVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
             ,(allocator<char> *)in_stack_fffffffffffffd50);
  local_f3 = 0;
  local_a8 = local_e8;
  local_a0 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x10d0b9);
  __l._M_len._0_4_ = in_stack_fffffffffffffd60;
  __l._M_array = (iterator)in_stack_fffffffffffffd58;
  __l._M_len._4_4_ = in_stack_fffffffffffffd64;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffd50,__l,(allocator_type *)in_stack_fffffffffffffd48);
  ImGuiWS::init(&local_60,(EVP_PKEY_CTX *)(ulong)uVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffd30);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x10d120);
  local_258 = (string *)&local_a8;
  do {
    local_258 = local_258 + -0x20;
    std::__cxx11::string::~string(local_258);
  } while (local_258 != local_e8);
  std::allocator<char>::~allocator(&local_f2);
  std::allocator<char>::~allocator((allocator<char> *)local_f1);
  std::__cxx11::string::~string(local_80);
  ImGui::GetIO();
  ImFontAtlas::GetTexDataAsAlpha8
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,(int *)in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd28,
             (int *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  ImGuiWS::setTexture(this,(TextureId)((ulong)psVar6 >> 0x20),(Type)psVar6,
                      (int32_t)((ulong)paVar5 >> 0x20),(int32_t)paVar5,pcVar4);
  regenerate((ImGuiWS *)in_stack_fffffffffffffe20,(int)in_stack_fffffffffffffe1c);
  VSync::VSync((VSync *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),rate_fps);
  do {
    main::counter = main::counter + 1;
    if (main::counter % 300 == 0) {
      regenerate((ImGuiWS *)in_stack_fffffffffffffe20,(int)in_stack_fffffffffffffe1c);
    }
    ImVec2::ImVec2(&local_128,640.0,480.0);
    local_58->DisplaySize = local_128;
    fVar3 = VSync::delta_s(in_stack_fffffffffffffd30);
    local_58->DeltaTime = fVar3;
    ImGui::NewFrame();
    ImVec2::ImVec2(&local_130,20.0,20.0);
    ImVec2::ImVec2(&local_138,0.0,0.0);
    ImGui::SetNextWindowPos(&local_130,0,&local_138);
    ImVec2::ImVec2(&local_140,400.0,100.0);
    ImGui::SetNextWindowSize(&local_140,0);
    ImGui::Begin(in_stack_00000130,in_stack_00000128,in_stack_00000124);
    iVar2 = ImGuiWS::nConnected((ImGuiWS *)0x10d4a7);
    ImGui::Text("Connected clients: %d");
    drawData = ImGui::GetIO();
    pcVar4 = (char *)(double)(1000.0 / drawData->Framerate);
    p_open = ImGui::GetIO();
    ImGui::Text(pcVar4,(double)p_open->Framerate,"Application average %.3f ms/frame (%.1f FPS)");
    ImGui::End();
    ImVec2::ImVec2(&local_148,20.0,140.0);
    ImVec2::ImVec2(&local_150,0.0,0.0);
    ImGui::SetNextWindowPos(&local_148,0,&local_150);
    ImVec2::ImVec2(&local_158,420.0,200.0);
    ImGui::SetNextWindowSize(&local_158,0);
    ImGui::Begin(in_stack_00000130,in_stack_00000128,in_stack_00000124);
    ImGui::Text("The images are regenerated on the server every ~5 seconds");
    ImVec2::ImVec2(&local_160,128.0,128.0);
    ImVec2::ImVec2(&local_168,0.0,0.0);
    ImVec2::ImVec2(&local_170,1.0,1.0);
    ImVec4::ImVec4(&local_180,1.0,1.0,1.0,1.0);
    ImVec4::ImVec4(&local_190,1.0,1.0,1.0,0.5);
    ImGui::Image(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 (ImVec2 *)in_stack_fffffffffffffdf8,(ImVec4 *)in_stack_fffffffffffffdf0,border_col)
    ;
    ImGui::SameLine(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20);
    ImVec2::ImVec2(&local_198,128.0,128.0);
    ImVec2::ImVec2(&local_1a0,0.0,0.0);
    ImVec2::ImVec2(&local_1a8,1.0,1.0);
    ImVec4::ImVec4(&local_1b8,1.0,1.0,1.0,1.0);
    ImVec4::ImVec4(&local_1c8,1.0,1.0,1.0,0.5);
    ImGui::Image(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 (ImVec2 *)in_stack_fffffffffffffdf8,(ImVec4 *)in_stack_fffffffffffffdf0,border_col)
    ;
    ImGui::SameLine(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20);
    in_stack_fffffffffffffd30 = (VSync *)(ulong)g_texture2Id;
    ImVec2::ImVec2(&local_1d0,128.0,128.0);
    ImVec2::ImVec2(&local_1d8,0.0,0.0);
    ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffe20,1.0,1.0);
    ImVec4::ImVec4((ImVec4 *)&stack0xfffffffffffffe10,1.0,1.0,1.0,1.0);
    ImVec4::ImVec4((ImVec4 *)&stack0xfffffffffffffe00,1.0,1.0,1.0,0.5);
    ImGui::Image(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 (ImVec2 *)in_stack_fffffffffffffdf8,(ImVec4 *)in_stack_fffffffffffffdf0,border_col)
    ;
    ImGui::End();
    ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffdf8,20.0,360.0);
    ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffdf0,0.0,0.0);
    ImGui::SetNextWindowPos((ImVec2 *)&stack0xfffffffffffffdf8,0,(ImVec2 *)&stack0xfffffffffffffdf0)
    ;
    ImGui::ShowAboutWindow((bool *)p_open);
    ImGui::Render();
    __stat_loc = ImGui::GetDrawData();
    ImGuiWS::setDrawData((ImGuiWS *)CONCAT44(fVar3,iVar2),(ImDrawData *)drawData);
    do {
      VSync::wait(&local_120,__stat_loc);
      in_stack_fffffffffffffd24 = (float)ImGuiWS::nConnected((ImGuiWS *)0x10d8fa);
    } while (in_stack_fffffffffffffd24 == 0.0);
  } while( true );
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s [port] [http-root]\n", argv[0]);

    int port = 5000;
    std::string httpRoot = "../examples";

    if (argc > 1) port = atoi(argv[1]);
    if (argc > 2) httpRoot = argv[2];

    // init dear imgui
    IMGUI_CHECKVERSION();
    ImGui::CreateContext();
    ImGuiIO& io = ImGui::GetIO(); (void)io;

    ImGui::StyleColorsDark();

    // setup imgui-ws
    ImGuiWS imguiWS;
    imguiWS.init(port, httpRoot + "/textures-null", { "", "index.html" });

    // prepare font texture
    {
        unsigned char * pixels;
        int width, height;
        ImGui::GetIO().Fonts->GetTexDataAsAlpha8(&pixels, &width, &height);
        imguiWS.setTexture(0, ImGuiWS::Texture::Type::Alpha8, width, height, (const char *) pixels);
    }

    // generate some random textures
    regenerate(imguiWS, 0);

    VSync vsync;

    while (true) {
        // regenerate random textures every ~5 seconds
        {
            static int counter = 0;
            if (++counter % (5*60) == 0) {
                regenerate(imguiWS, counter);
            }
        }

        io.DisplaySize = ImVec2(640, 480);
        io.DeltaTime = vsync.delta_s();

        ImGui::NewFrame();

        ImGui::SetNextWindowPos({ 20, 20 });
        ImGui::SetNextWindowSize({ 400, 100 });
        ImGui::Begin("Hello, world!");
        ImGui::Text("Connected clients: %d", imguiWS.nConnected());
        ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / ImGui::GetIO().Framerate, ImGui::GetIO().Framerate);
        ImGui::End();

        ImGui::SetNextWindowPos({ 20, 140 });
        ImGui::SetNextWindowSize({ 420, 200 });
        ImGui::Begin("Some random images");
        ImGui::Text("The images are regenerated on the server every ~5 seconds");
        ImGui::Image((void *)(intptr_t) g_texture0Id, { 128, 128 }, ImVec2(0,0), ImVec2(1,1), ImVec4(1.0f,1.0f,1.0f,1.0f), ImVec4(1.0f,1.0f,1.0f,0.5f));
        ImGui::SameLine();
        ImGui::Image((void *)(intptr_t) g_texture1Id, { 128, 128 }, ImVec2(0,0), ImVec2(1,1), ImVec4(1.0f,1.0f,1.0f,1.0f), ImVec4(1.0f,1.0f,1.0f,0.5f));
        ImGui::SameLine();
        ImGui::Image((void *)(intptr_t) g_texture2Id, { 128, 128 }, ImVec2(0,0), ImVec2(1,1), ImVec4(1.0f,1.0f,1.0f,1.0f), ImVec4(1.0f,1.0f,1.0f,0.5f));
        ImGui::End();

        ImGui::SetNextWindowPos({ 20, 360 });
        ImGui::ShowAboutWindow();

        // generate ImDrawData
        ImGui::Render();

        // store ImDrawData for asynchronous dispatching to WS clients
        imguiWS.setDrawData(ImGui::GetDrawData());

        // if not clients are connected, just sleep to save CPU
        do {
            vsync.wait();
        } while (imguiWS.nConnected() == 0);
    }

    ImGui::DestroyContext();

    return 0;
}